

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

pcut_item_t * pcut_find_by_id(pcut_item_t *first,int id)

{
  pcut_item_t *item;
  
  for (item = pcut_get_real(first); (item != (pcut_item_t *)0x0 && (item->id != id));
      item = pcut_get_real_next(item)) {
  }
  return item;
}

Assistant:

static pcut_item_t *pcut_find_by_id(pcut_item_t *first, int id) {
	pcut_item_t *it = pcut_get_real(first);
	while (it != NULL) {
		if (it->id == id) {
			return it;
		}
		it = pcut_get_real_next(it);
	}
	return NULL;
}